

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.h
# Opt level: O3

Node<MeshLib::Edge> * __thiscall
AVL::Node<MeshLib::Edge>::find_node(Node<MeshLib::Edge> *this,Edge *inData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  iVar1 = (inData->key).m_s;
  iVar2 = (inData->key).m_t;
  iVar4 = (this->data->key).m_s;
  iVar3 = (this->data->key).m_t;
  bVar5 = iVar1 == iVar4;
  if (!bVar5 || iVar2 != iVar3) {
    do {
      this = (&this->left)[(bVar5 ^ 1U | iVar3 <= iVar2) & iVar4 <= iVar1];
      iVar4 = (this->data->key).m_s;
      iVar3 = (this->data->key).m_t;
      bVar5 = iVar1 == iVar4;
    } while (iVar2 != iVar3 || !bVar5);
  }
  return this;
}

Assistant:

Node<T> * find_node (T * inData) 
    {
        if (this == NULL)
            return NULL;

        if ( *inData == *data)
            return this;

        if (*inData < *data)
            return left -> find_node (inData);
        else
            return right -> find_node (inData);
    }